

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase34::run(TestCase34 *this)

{
  bool bVar1;
  int osErrorNumber;
  void *pvVar2;
  uchar *puVar3;
  size_t __n;
  ArrayPtr<const_unsigned_char> AVar4;
  ArrayPtr<unsigned_char> AVar5;
  ArrayPtr<unsigned_char> local_198;
  ArrayPtr<const_unsigned_char> local_188;
  bool local_171;
  undefined1 auStack_170 [7];
  bool _kj_shouldLog;
  size_t local_168;
  ArrayPtr<const_unsigned_char> local_160;
  ArrayPtr<const_unsigned_char> local_150;
  undefined1 local_140 [8];
  DebugComparison<kj::ArrayPtr<const_unsigned_char>,_kj::ArrayPtr<unsigned_char>_> _kjCondition;
  void *local_100;
  uchar local_f8 [8];
  byte buf [6];
  void *local_e8;
  void *local_e0;
  void *local_d8;
  void *local_d0;
  undefined1 local_c8 [8];
  ArrayPtr<const_unsigned_char> pieces [5];
  OwnFd local_6c;
  undefined1 local_68 [8];
  FdOutputStream out;
  undefined1 local_50 [8];
  FdInputStream in;
  Fault local_30;
  Fault f;
  SyscallResult local_1c;
  undefined1 local_18 [4];
  SyscallResult _kjSyscallResult;
  int fds [2];
  TestCase34 *this_local;
  
  memset(local_18,0,8);
  f.exception = (Exception *)local_18;
  local_1c = kj::_::Debug::syscall<kj::(anonymous_namespace)::TestCase34::run()::__0>
                       ((anon_class_8_1_ba1d46d5 *)&f,false);
  pvVar2 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_1c);
  if (pvVar2 == (void *)0x0) {
    osErrorNumber = kj::_::Debug::SyscallResult::getErrorNumber(&local_1c);
    kj::_::Debug::Fault::Fault
              (&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/io-test.c++"
               ,0x27,osErrorNumber,"miniposix::pipe(fds)","");
    kj::_::Debug::Fault::fatal(&local_30);
  }
  OwnFd::OwnFd(&out.autoclose,(int)local_18);
  FdInputStream::FdInputStream((FdInputStream *)local_50,&out.autoclose);
  OwnFd::~OwnFd(&out.autoclose);
  OwnFd::OwnFd(&local_6c,_kjSyscallResult.errorNumber);
  FdOutputStream::FdOutputStream((FdOutputStream *)local_68,&local_6c);
  OwnFd::~OwnFd(&local_6c);
  local_d0 = (void *)0x0;
  puVar3 = implicitCast<unsigned_char_const*,decltype(nullptr)>(&local_d0);
  AVar4 = arrayPtr<unsigned_char_const>(puVar3,0);
  pieces[0].ptr = (uchar *)AVar4.size_;
  local_c8 = (undefined1  [8])AVar4.ptr;
  pieces._8_16_ = (undefined1  [16])operator___kjb<kj::_::ByteLiteral<4UL>__102,_111,_111__>();
  local_d8 = (void *)0x0;
  puVar3 = implicitCast<unsigned_char_const*,decltype(nullptr)>(&local_d8);
  pieces._24_16_ = (undefined1  [16])arrayPtr<unsigned_char_const>(puVar3,0);
  pieces._40_16_ = (undefined1  [16])operator___kjb<kj::_::ByteLiteral<4UL>__98,_97,_114__>();
  local_e0 = (void *)0x0;
  puVar3 = implicitCast<unsigned_char_const*,decltype(nullptr)>(&local_e0);
  pieces._56_16_ = (undefined1  [16])arrayPtr<unsigned_char_const>(puVar3,0);
  __n = pieces[4].ptr;
  ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>::ArrayPtr<5ul>
            ((ArrayPtr<kj::ArrayPtr<unsigned_char_const>const> *)buf,
             (ArrayPtr<const_unsigned_char> (*) [5])local_c8);
  FdOutputStream::write((FdOutputStream *)local_68,buf._0_4_,local_e8,__n);
  local_f8[4] = '\0';
  local_f8[5] = '\0';
  local_f8[0] = '\0';
  local_f8[1] = '\0';
  local_f8[2] = '\0';
  local_f8[3] = '\0';
  ArrayPtr<unsigned_char>::ArrayPtr<6ul>
            ((ArrayPtr<unsigned_char> *)&_kjCondition.result,(uchar (*) [6])local_f8);
  InputStream::read((InputStream *)local_50,_kjCondition._48_4_,local_100,__n);
  local_160 = operator___kjb<kj::_::ByteLiteral<7UL>__102,_111,_111,_98,_97,_114__>();
  local_150 = (ArrayPtr<const_unsigned_char>)
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_160);
  _auStack_170 = arrayPtr<unsigned_char,6ul>((uchar (*) [6])local_f8);
  kj::_::DebugExpression<kj::ArrayPtr<unsigned_char_const>>::operator==
            ((DebugComparison<kj::ArrayPtr<const_unsigned_char>,_kj::ArrayPtr<unsigned_char>_> *)
             local_140,(DebugExpression<kj::ArrayPtr<unsigned_char_const>> *)&local_150,
             (ArrayPtr<unsigned_char> *)auStack_170);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_140);
  if (!bVar1) {
    local_171 = kj::_::Debug::shouldLog(ERROR);
    while (local_171 != false) {
      AVar4 = operator___kjb<kj::_::ByteLiteral<7UL>__102,_111,_111,_98,_97,_114__>();
      local_188 = AVar4;
      AVar5 = arrayPtr<unsigned_char,6ul>((uchar (*) [6])local_f8);
      local_198 = AVar5;
      kj::_::Debug::
      log<char_const(&)[51],kj::_::DebugComparison<kj::ArrayPtr<unsigned_char_const>,kj::ArrayPtr<unsigned_char>>&,kj::ArrayPtr<unsigned_char_const>,kj::ArrayPtr<unsigned_char>>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/io-test.c++"
                 ,0x38,ERROR,
                 "\"failed: expected \" \"(\\\"foobar\\\"_kjb) == (arrayPtr(buf))\", _kjCondition, \"foobar\"_kjb, arrayPtr(buf)"
                 ,(char (*) [51])"failed: expected (\"foobar\"_kjb) == (arrayPtr(buf))",
                 (DebugComparison<kj::ArrayPtr<const_unsigned_char>,_kj::ArrayPtr<unsigned_char>_> *
                 )local_140,&local_188,&local_198);
      local_171 = false;
    }
  }
  FdOutputStream::~FdOutputStream((FdOutputStream *)local_68);
  FdInputStream::~FdInputStream((FdInputStream *)local_50);
  return;
}

Assistant:

TEST(Io, WriteVec) {
  // Check that writing an array of arrays works even when some of the arrays are empty.  (This
  // used to not work in some cases.)

  int fds[2]{};
  KJ_SYSCALL(miniposix::pipe(fds));

  FdInputStream in((OwnFd(fds[0])));
  FdOutputStream out((OwnFd(fds[1])));

  ArrayPtr<const byte> pieces[5] = {
    arrayPtr(implicitCast<const byte*>(nullptr), 0),
    "foo"_kjb,
    arrayPtr(implicitCast<const byte*>(nullptr), 0),
    "bar"_kjb,
    arrayPtr(implicitCast<const byte*>(nullptr), 0)
  };

  out.write(pieces);

  byte buf[6]{};
  in.read(buf);
  EXPECT_EQ("foobar"_kjb, arrayPtr(buf));
}